

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int mbedtls_pk_parse_public_key(mbedtls_pk_context *ctx,uchar *key,size_t keylen)

{
  mbedtls_pk_type_t *pmVar1;
  mbedtls_pk_info_t *pmVar2;
  mbedtls_rsa_context *pmVar3;
  uchar *end;
  undefined1 local_60 [8];
  mbedtls_pem_context pem;
  size_t len;
  mbedtls_pk_info_t *pk_info;
  uchar *p;
  size_t sStack_28;
  int ret;
  size_t keylen_local;
  uchar *key_local;
  mbedtls_pk_context *ctx_local;
  
  p._4_4_ = 0xffffff92;
  if (keylen == 0) {
    ctx_local._4_4_ = -0x3d00;
  }
  else {
    sStack_28 = keylen;
    keylen_local = (size_t)key;
    key_local = (uchar *)ctx;
    mbedtls_pem_init((mbedtls_pem_context *)local_60);
    if (*(char *)(keylen_local + (sStack_28 - 1)) == '\0') {
      p._4_4_ = mbedtls_pem_read_buffer
                          ((mbedtls_pem_context *)local_60,"-----BEGIN RSA PUBLIC KEY-----",
                           "-----END RSA PUBLIC KEY-----",(uchar *)keylen_local,(uchar *)0x0,0,
                           (size_t *)&pem.info);
    }
    else {
      p._4_4_ = -0x1080;
    }
    if (p._4_4_ == 0) {
      pk_info = (mbedtls_pk_info_t *)local_60;
      pmVar2 = mbedtls_pk_info_from_type(MBEDTLS_PK_RSA);
      if (pmVar2 == (mbedtls_pk_info_t *)0x0) {
        ctx_local._4_4_ = -0x3c80;
      }
      else {
        p._4_4_ = mbedtls_pk_setup((mbedtls_pk_context *)key_local,pmVar2);
        ctx_local._4_4_ = p._4_4_;
        if (p._4_4_ == 0) {
          pmVar1 = &pk_info->type;
          pmVar3 = mbedtls_pk_rsa(*(mbedtls_pk_context *)key_local);
          p._4_4_ = pk_get_rsapubkey((uchar **)&pk_info,pem.buf + (long)pmVar1,pmVar3);
          if (p._4_4_ != 0) {
            mbedtls_pk_free((mbedtls_pk_context *)key_local);
          }
          mbedtls_pem_free((mbedtls_pem_context *)local_60);
          ctx_local._4_4_ = p._4_4_;
        }
      }
    }
    else if (p._4_4_ == -0x1080) {
      if (*(char *)(keylen_local + (sStack_28 - 1)) == '\0') {
        p._4_4_ = mbedtls_pem_read_buffer
                            ((mbedtls_pem_context *)local_60,"-----BEGIN PUBLIC KEY-----",
                             "-----END PUBLIC KEY-----",(uchar *)keylen_local,(uchar *)0x0,0,
                             (size_t *)&pem.info);
      }
      else {
        p._4_4_ = -0x1080;
      }
      if (p._4_4_ == 0) {
        pk_info = (mbedtls_pk_info_t *)local_60;
        p._4_4_ = mbedtls_pk_parse_subpubkey
                            ((uchar **)&pk_info,pem.buf + (long)(mbedtls_pk_type_t *)local_60,
                             (mbedtls_pk_context *)key_local);
        mbedtls_pem_free((mbedtls_pem_context *)local_60);
        ctx_local._4_4_ = p._4_4_;
      }
      else if (p._4_4_ == -0x1080) {
        mbedtls_pem_free((mbedtls_pem_context *)local_60);
        pmVar2 = mbedtls_pk_info_from_type(MBEDTLS_PK_RSA);
        if (pmVar2 == (mbedtls_pk_info_t *)0x0) {
          ctx_local._4_4_ = -0x3c80;
        }
        else {
          p._4_4_ = mbedtls_pk_setup((mbedtls_pk_context *)key_local,pmVar2);
          ctx_local._4_4_ = p._4_4_;
          if (p._4_4_ == 0) {
            pk_info = (mbedtls_pk_info_t *)keylen_local;
            end = (uchar *)(keylen_local + sStack_28);
            pmVar3 = mbedtls_pk_rsa(*(mbedtls_pk_context *)key_local);
            p._4_4_ = pk_get_rsapubkey((uchar **)&pk_info,end,pmVar3);
            ctx_local._4_4_ = p._4_4_;
            if (p._4_4_ != 0) {
              mbedtls_pk_free((mbedtls_pk_context *)key_local);
              if (p._4_4_ == -0x3b62) {
                pk_info = (mbedtls_pk_info_t *)keylen_local;
                ctx_local._4_4_ =
                     mbedtls_pk_parse_subpubkey
                               ((uchar **)&pk_info,(uchar *)(keylen_local + sStack_28),
                                (mbedtls_pk_context *)key_local);
              }
              else {
                ctx_local._4_4_ = p._4_4_;
              }
            }
          }
        }
      }
      else {
        mbedtls_pem_free((mbedtls_pem_context *)local_60);
        ctx_local._4_4_ = p._4_4_;
      }
    }
    else {
      mbedtls_pem_free((mbedtls_pem_context *)local_60);
      ctx_local._4_4_ = p._4_4_;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_pk_parse_public_key( mbedtls_pk_context *ctx,
                         const unsigned char *key, size_t keylen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *p;
#if defined(MBEDTLS_RSA_C)
    const mbedtls_pk_info_t *pk_info;
#endif
#if defined(MBEDTLS_PEM_PARSE_C)
    size_t len;
    mbedtls_pem_context pem;
#endif

    PK_VALIDATE_RET( ctx != NULL );
    if( keylen == 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT );
    PK_VALIDATE_RET( key != NULL || keylen == 0 );

#if defined(MBEDTLS_PEM_PARSE_C)
    mbedtls_pem_init( &pem );
#if defined(MBEDTLS_RSA_C)
    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if( key[keylen - 1] != '\0' )
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    else
        ret = mbedtls_pem_read_buffer( &pem,
                               "-----BEGIN RSA PUBLIC KEY-----",
                               "-----END RSA PUBLIC KEY-----",
                               key, NULL, 0, &len );

    if( ret == 0 )
    {
        p = pem.buf;
        if( ( pk_info = mbedtls_pk_info_from_type( MBEDTLS_PK_RSA ) ) == NULL )
            return( MBEDTLS_ERR_PK_UNKNOWN_PK_ALG );

        if( ( ret = mbedtls_pk_setup( ctx, pk_info ) ) != 0 )
            return( ret );

        if ( ( ret = pk_get_rsapubkey( &p, p + pem.buflen, mbedtls_pk_rsa( *ctx ) ) ) != 0 )
            mbedtls_pk_free( ctx );

        mbedtls_pem_free( &pem );
        return( ret );
    }
    else if( ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT )
    {
        mbedtls_pem_free( &pem );
        return( ret );
    }
#endif /* MBEDTLS_RSA_C */

    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if( key[keylen - 1] != '\0' )
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    else
        ret = mbedtls_pem_read_buffer( &pem,
                "-----BEGIN PUBLIC KEY-----",
                "-----END PUBLIC KEY-----",
                key, NULL, 0, &len );

    if( ret == 0 )
    {
        /*
         * Was PEM encoded
         */
        p = pem.buf;

        ret = mbedtls_pk_parse_subpubkey( &p,  p + pem.buflen, ctx );
        mbedtls_pem_free( &pem );
        return( ret );
    }
    else if( ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT )
    {
        mbedtls_pem_free( &pem );
        return( ret );
    }
    mbedtls_pem_free( &pem );
#endif /* MBEDTLS_PEM_PARSE_C */

#if defined(MBEDTLS_RSA_C)
    if( ( pk_info = mbedtls_pk_info_from_type( MBEDTLS_PK_RSA ) ) == NULL )
        return( MBEDTLS_ERR_PK_UNKNOWN_PK_ALG );

    if( ( ret = mbedtls_pk_setup( ctx, pk_info ) ) != 0 )
        return( ret );

    p = (unsigned char *)key;
    ret = pk_get_rsapubkey( &p, p + keylen, mbedtls_pk_rsa( *ctx ) );
    if( ret == 0 )
    {
        return( ret );
    }
    mbedtls_pk_free( ctx );
    if( ret != ( MBEDTLS_ERR_PK_INVALID_PUBKEY + MBEDTLS_ERR_ASN1_UNEXPECTED_TAG ) )
    {
        return( ret );
    }
#endif /* MBEDTLS_RSA_C */
    p = (unsigned char *) key;

    ret = mbedtls_pk_parse_subpubkey( &p, p + keylen, ctx );

    return( ret );
}